

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubFunc
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint uVar1;
  pointer pvVar2;
  HeapType HVar3;
  HeapType HVar4;
  uint32_t uVar5;
  Shareability SVar6;
  BasicHeapType BVar7;
  value_type *pvVar8;
  HeapType *this_00;
  ulong uVar9;
  HeapType local_70;
  Entry local_68;
  HeapType HStack_58;
  HeapType ht;
  
  uVar5 = Random::upTo(this->rand,8);
  if (uVar5 == 1) {
    this_00 = (HeapType *)&HeapTypes::nofunc;
  }
  else if (uVar5 == 0) {
    this_00 = (HeapType *)&HeapTypes::func;
  }
  else {
    HStack_58.id = 0;
    ht.id = 0;
    uVar1 = (this->recGroupEnds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[this->index];
    for (uVar9 = 0; HVar4.id = ht.id, HVar3.id = HStack_58.id, uVar1 != uVar9; uVar9 = uVar9 + 1) {
      pvVar2 = (this->typeKinds).
               super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar2 != (pointer)0x0) &&
         (*(__index_type *)
           ((long)&pvVar2[uVar9].
                   super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                   .
                   super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
           + 1) == '\0')) {
        local_68.builder = this->builder;
        local_68.index = uVar9;
        local_70 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_68);
        SVar6 = ::wasm::HeapType::getShared();
        if (SVar6 == share) {
          local_68.builder = this->builder;
          local_68.index = uVar9;
          local_70 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_68);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &stack0xffffffffffffffa8,&local_70);
        }
      }
    }
    if (ht.id != HStack_58.id) {
      pvVar8 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this->rand,
                          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &stack0xffffffffffffffa8);
      this = (HeapTypeGeneratorImpl *)pvVar8->id;
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &stack0xffffffffffffffa8);
    if (HVar4.id != HVar3.id) {
      return (HeapType)(uintptr_t)this;
    }
    HStack_58.id = (uintptr_t)(pointer)0x10;
    if ((uVar5 & 1) == 0) {
      HStack_58.id = (uintptr_t)(pointer)0x68;
    }
    this_00 = &stack0xffffffffffffffa8;
  }
  BVar7 = HeapType::getBasic(this_00,share);
  return (HeapType)(ulong)BVar7;
}

Assistant:

HeapType pickSubFunc(Shareability share) {
    auto choice = rand.upTo(8);
    switch (choice) {
      case 0:
        return HeapTypes::func.getBasic(share);
      case 1:
        return HeapTypes::nofunc.getBasic(share);
      default: {
        if (auto type = pickKind<SignatureKind>(share)) {
          return *type;
        }
        HeapType ht = (choice % 2) ? HeapType::func : HeapType::nofunc;
        return ht.getBasic(share);
      }
    }
  }